

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLBigInteger.cpp
# Opt level: O3

void xercesc_4_0::XMLBigInteger::parseBigInteger
               (XMLCh *toConvert,XMLCh *retBuffer,int *signValue,MemoryManager *manager)

{
  XMLCh XVar1;
  long lVar2;
  XMLCh *pXVar3;
  NumberFormatException *this;
  XMLCh *pXVar4;
  ulong uVar5;
  long lVar6;
  
  if ((toConvert != (XMLCh *)0x0) && (uVar5 = (ulong)(ushort)*toConvert, uVar5 != 0)) {
    pXVar3 = toConvert;
    if ((char)(&XMLChar1_0::fgCharCharsTable1_0)[uVar5] < '\0') {
      do {
        pXVar4 = pXVar3 + 1;
        uVar5 = (ulong)(ushort)*pXVar4;
        pXVar3 = pXVar3 + 1;
      } while ((char)(&XMLChar1_0::fgCharCharsTable1_0)[uVar5] < '\0');
      if (*pXVar4 == L'\0') {
        this = (NumberFormatException *)__cxa_allocate_exception(0x30);
        NumberFormatException::NumberFormatException
                  (this,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLBigInteger.cpp"
                   ,0x76,XMLNUM_WSString,manager);
        goto LAB_00249d64;
      }
    }
    do {
      XVar1 = *toConvert;
      toConvert = toConvert + 1;
    } while (XVar1 != L'\0');
    do {
      pXVar4 = toConvert + -2;
      toConvert = toConvert + -1;
    } while ((char)(&XMLChar1_0::fgCharCharsTable1_0)[(ushort)*pXVar4] < '\0');
    *signValue = 1;
    if ((short)uVar5 == 0x2b) {
      pXVar4 = pXVar3 + 1;
      if (toConvert == pXVar3 + 1) {
        this = (NumberFormatException *)__cxa_allocate_exception(0x30);
        NumberFormatException::NumberFormatException
                  (this,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLBigInteger.cpp"
                   ,0x96,XMLNUM_Inv_chars,manager);
        goto LAB_00249d64;
      }
    }
    else {
      pXVar4 = pXVar3;
      if ((int)uVar5 == 0x2d) {
        *signValue = -1;
        pXVar4 = pXVar3 + 1;
        if (toConvert == pXVar3 + 1) {
          this = (NumberFormatException *)__cxa_allocate_exception(0x30);
          NumberFormatException::NumberFormatException
                    (this,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLBigInteger.cpp"
                     ,0x8d,XMLNUM_Inv_chars,manager);
          goto LAB_00249d64;
        }
      }
    }
    do {
      pXVar3 = pXVar4;
      pXVar4 = pXVar3 + 1;
    } while (*pXVar3 == L'0');
    if (pXVar3 < toConvert) {
      lVar2 = -2;
      do {
        lVar6 = lVar2;
        if ((ushort)(*(short *)((long)pXVar4 + lVar6) - 0x3aU) < 0xfff6) {
          this = (NumberFormatException *)__cxa_allocate_exception(0x30);
          NumberFormatException::NumberFormatException
                    (this,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLBigInteger.cpp"
                     ,0xab,XMLNUM_Inv_chars,manager);
          goto LAB_00249d64;
        }
        *(short *)((long)retBuffer + lVar6 + 2) = *(short *)((long)pXVar4 + lVar6);
        lVar2 = lVar6 + 2;
      } while ((XMLCh *)((long)pXVar4 + lVar6 + 2) < toConvert);
      *(undefined2 *)((long)retBuffer + lVar6 + 4) = 0;
    }
    else {
      *signValue = 0;
    }
    return;
  }
  this = (NumberFormatException *)__cxa_allocate_exception(0x30);
  NumberFormatException::NumberFormatException
            (this,
             "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLBigInteger.cpp"
             ,0x68,XMLNUM_emptyString,manager);
LAB_00249d64:
  __cxa_throw(this,&NumberFormatException::typeinfo,XMLException::~XMLException);
}

Assistant:

void XMLBigInteger::parseBigInteger(const XMLCh* const toConvert
                                  , XMLCh* const retBuffer
                                  , int&   signValue
                                  , MemoryManager* const manager)
{
    // If no string, then its a failure
    if ((!toConvert) || (!*toConvert))
        ThrowXMLwithMemMgr(NumberFormatException, XMLExcepts::XMLNUM_emptyString, manager);

    //
    // Note: in Java's BigInteger, it seems any leading and/or trailing
    // whitespaces are not allowed. If this is the case, we may
    // need to skip the trimming below.
    //

    // Scan past any whitespace. If we hit the end, then return failure
    const XMLCh* startPtr = toConvert;
    while (XMLChar1_0::isWhitespace(*startPtr))
        startPtr++;

    if (!*startPtr)
        ThrowXMLwithMemMgr(NumberFormatException, XMLExcepts::XMLNUM_WSString, manager);

    // Start at the end and work back through any whitespace
    const XMLCh* endPtr = toConvert + XMLString::stringLen(toConvert);
    while (XMLChar1_0::isWhitespace(*(endPtr - 1)))
        endPtr--;

    //
    //  Work through what remains and convert each char to a digit.
    //  anything other than '
    //
    XMLCh* retPtr = retBuffer;
    signValue = 1;

    //
    // '+' or '-' is allowed only at the first position
    //
    if (*startPtr == chDash)
    {
        signValue = -1;
        startPtr++;
        if (startPtr == endPtr)
        {
            ThrowXMLwithMemMgr(NumberFormatException, XMLExcepts::XMLNUM_Inv_chars, manager);
        }
    }
    else if (*startPtr == chPlus)
    {
        // skip the '+'
        startPtr++;
        if (startPtr == endPtr)
        {
            ThrowXMLwithMemMgr(NumberFormatException, XMLExcepts::XMLNUM_Inv_chars, manager);
        }
    }


    // Scan past any leading zero.
    while (*startPtr == chDigit_0)
        startPtr++;

    if (startPtr >= endPtr)
    {
        signValue = 0;
        // containning zero, only zero, nothing but zero
        // it is a zero, indeed
        return;
    }

    while (startPtr < endPtr)
    {
        // If not valid decimal digit, then an error
        if ((*startPtr < chDigit_0) || (*startPtr > chDigit_9))
            ThrowXMLwithMemMgr(NumberFormatException, XMLExcepts::XMLNUM_Inv_chars, manager);

        // copy over
        *retPtr = *startPtr;
        retPtr++;
        startPtr++;
    }

    *retPtr = 0;   //terminated
    return;
}